

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O3

void __thiscall FirewirePort::StopCycleStartPacket(FirewirePort *this)

{
  raw1394handle_t prVar1;
  ostream *poVar2;
  undefined2 uVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  quadlet_t data_stop_cmc;
  undefined4 local_1c;
  
  local_1c = 0x10000;
  prVar1 = this->handle;
  uVar3 = raw1394_get_local_id(prVar1);
  iVar4 = raw1394_write(prVar1,uVar3,0xfffff0000000,4,&local_1c);
  poVar2 = (this->super_BasePort).outStr;
  if (iVar4 == 0) {
    pcVar6 = "FirewirePort::Init: successfully disabled cycle start packet";
    lVar5 = 0x3c;
  }
  else {
    pcVar6 = "FirewirePort::Init: error, can NOT disable cycle start packet";
    lVar5 = 0x3d;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,lVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void FirewirePort::StopCycleStartPacket(void)
{
    // IMPORTANT: Disable Cycle Start Packet, no isochronous
    int rc = 0;  // return code
    quadlet_t data_stop_cmc = bswap_32(0x100);
    rc = raw1394_write(handle,
                       raw1394_get_local_id(handle),
                       CSR_REGISTER_BASE + CSR_STATE_CLEAR,
                       4,
                       &data_stop_cmc);
    if (rc) {
        outStr << "FirewirePort::Init: error, can NOT disable cycle start packet" << std::endl;
    } else {
        outStr << "FirewirePort::Init: successfully disabled cycle start packet" << std::endl;
    }
}